

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Bot.cpp
# Opt level: O0

void __thiscall
IRC_Bot::setCommandAccessLevels::anon_class_16_2_306f8aac::operator()
          (anon_class_16_2_306f8aac *this,Config *in_section)

{
  IRC_Bot *this_00;
  string_view channel;
  string_view trigger;
  string_view in_string;
  string_view trigger_00;
  size_t sVar1;
  bool bVar2;
  int accessLevel;
  int iVar3;
  Config *this_01;
  ValuesHashTable *this_02;
  reference this_03;
  size_type __len;
  char *pcVar4;
  IRCCommand *pIVar5;
  IRCCommand *this_04;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  __sv_type _Var7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  IRCCommand *local_a0;
  char *local_98;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  IRCCommand *local_80;
  IRCCommand *command;
  string_view tmp_sub_key;
  string_view tmp_key;
  size_t tmp_index;
  value_type *entry;
  const_iterator __end2;
  const_iterator __begin2;
  ValuesHashTable *__range2;
  char *local_28;
  Config *section;
  Config *in_section_local;
  anon_class_16_2_306f8aac *this_local;
  
  this_00 = this->this;
  if (in_section != (Config *)0x0) {
    bVar6 = sv("Commands",8);
    __range2 = (ValuesHashTable *)bVar6._M_len;
    local_28 = bVar6._M_str;
    this_01 = (Config *)Jupiter::Config::getSection(in_section,__range2,local_28);
    if (this_01 != (Config *)0x0) {
      this_02 = Jupiter::Config::getTable_abi_cxx11_(this_01);
      __end2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(this_02);
      entry = (value_type *)
              std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(this_02);
      while (bVar2 = std::__detail::operator==
                               (&__end2.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                  *)&entry), ((bVar2 ^ 0xffU) & 1) != 0) {
        this_03 = std::__detail::
                  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                  ::operator*(&__end2);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&tmp_sub_key._M_str);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&command);
        __len = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(&this_03->first,'.',0);
        if (__len == 0xffffffffffffffff) {
          _Var7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_03);
          pIVar5 = getCommand(this_00,_Var7);
          local_80 = pIVar5;
          if ((pIVar5 != (IRCCommand *)0x0) &&
             ((this->in_command == (IRCCommand *)0x0 || (this->in_command == pIVar5)))) {
            _Var7 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&this_03->second);
            iVar3 = Jupiter::from_string<int>(_Var7);
            IRCCommand::setAccessLevel(pIVar5,iVar3);
          }
        }
        else {
          pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   data(&this_03->first);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_90,pcVar4,__len);
          pcVar4 = local_90._M_str;
          tmp_sub_key._M_str = (char *)local_90._M_len;
          _Var7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_03);
          local_a0 = (IRCCommand *)_Var7._M_len;
          command = local_a0;
          local_98 = _Var7._M_str;
          tmp_sub_key._M_len = (size_t)local_98;
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&command,__len + 1);
          sVar1 = tmp_sub_key._M_len;
          pIVar5 = command;
          bVar8 = sv("Type.",5);
          bVar6._M_str = (char *)sVar1;
          bVar6._M_len = (size_t)pIVar5;
          bVar2 = jessilib::starts_withi<char,char>(bVar6,bVar8);
          sVar1 = tmp_sub_key._M_len;
          pIVar5 = command;
          if (bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                      ((basic_string_view<char,_std::char_traits<char>_> *)&command,5);
            trigger_00._M_str = pcVar4;
            trigger_00._M_len = (size_t)tmp_sub_key._M_str;
            pIVar5 = getCommand(this_00,trigger_00);
            local_80 = pIVar5;
            if ((pIVar5 != (IRCCommand *)0x0) &&
               ((this->in_command == (IRCCommand *)0x0 || (this->in_command == pIVar5)))) {
              in_string._M_str = (char *)tmp_sub_key._M_len;
              in_string._M_len = (size_t)command;
              iVar3 = Jupiter::from_string<int>(in_string);
              _Var7 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&this_03->second);
              accessLevel = Jupiter::from_string<int>(_Var7);
              IRCCommand::setAccessLevel(pIVar5,iVar3,accessLevel);
            }
          }
          else {
            bVar6 = sv("Channel.",8);
            bVar8._M_str = (char *)sVar1;
            bVar8._M_len = (size_t)pIVar5;
            bVar2 = jessilib::starts_withi<char,char>(bVar8,bVar6);
            if (bVar2) {
              std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                        ((basic_string_view<char,_std::char_traits<char>_> *)&command,8);
              trigger._M_str = pcVar4;
              trigger._M_len = (size_t)tmp_sub_key._M_str;
              this_04 = getCommand(this_00,trigger);
              sVar1 = tmp_sub_key._M_len;
              pIVar5 = command;
              local_80 = this_04;
              if ((this_04 != (IRCCommand *)0x0) &&
                 ((this->in_command == (IRCCommand *)0x0 || (this->in_command == this_04)))) {
                _Var7 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&this_03->second);
                iVar3 = Jupiter::from_string<int>(_Var7);
                channel._M_str = (char *)sVar1;
                channel._M_len = (size_t)pIVar5;
                IRCCommand::setAccessLevel(this_04,channel,iVar3);
              }
            }
          }
        }
        std::__detail::
        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
        ::operator++(&__end2);
      }
    }
  }
  return;
}

Assistant:

void IRC_Bot::setCommandAccessLevels(IRCCommand *in_command) {
	auto set_command_access_levels = [this, in_command](Jupiter::Config *in_section) {
		if (in_section == nullptr) {
			return;
		}

		Jupiter::Config *section = in_section->getSection("Commands"sv);
		if (section == nullptr) {
			return;
		}

		for (auto& entry : section->getTable()) {
			size_t tmp_index;
			std::string_view tmp_key, tmp_sub_key;
			IRCCommand *command;

			tmp_index = entry.first.find('.');
			if (tmp_index != std::string_view::npos) {
				// non-default access assignment

				tmp_key = std::string_view(entry.first.data(), tmp_index);

				tmp_sub_key = entry.first;
				tmp_sub_key.remove_prefix(tmp_index + 1);

				if (jessilib::starts_withi(tmp_sub_key, "Type."sv)) {
					tmp_sub_key.remove_prefix(5); // strip "Type."

					command = this->getCommand(tmp_key);
					if (command != nullptr && (in_command == nullptr || in_command == command)) {
						command->setAccessLevel(Jupiter::from_string<int>(tmp_sub_key), Jupiter::from_string<int>(entry.second));
					}
				}
				else if (jessilib::starts_withi(tmp_sub_key, "Channel."sv)) {
					tmp_sub_key.remove_prefix(8); // strip "Channel."

					// Assign access level to command (if command exists)
					command = this->getCommand(tmp_key);
					if (command != nullptr && (in_command == nullptr || in_command == command))
						command->setAccessLevel(tmp_sub_key, Jupiter::from_string<int>(entry.second));
				}
			}
			else {
				// Assign access level to command (if command exists)
				command = this->getCommand(entry.first);
				if (command != nullptr && (in_command == nullptr || in_command == command))
					command->setAccessLevel(Jupiter::from_string<int>(entry.second));
			}
		};
	};

	set_command_access_levels(getSecondaryConfigSection());
	set_command_access_levels(getPrimaryConfigSection());
}